

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

dtree_node_t * get_node(dtree_node_t *node,uint32 id)

{
  dtree_node_t *ret;
  uint32 id_local;
  dtree_node_t *node_local;
  
  node_local = node;
  if (node->node_id != id) {
    if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
      node_local = (dtree_node_t *)0x0;
    }
    else {
      node_local = get_node(node->y,id);
      if (node_local == (dtree_node_t *)0x0) {
        node_local = get_node(node->n,id);
      }
    }
  }
  return node_local;
}

Assistant:

dtree_node_t *
get_node(dtree_node_t *node,
	 uint32 id)
{
    dtree_node_t *ret;

    if (node->node_id == id)
	return node;
    else if (!IS_LEAF(node)) {
	ret = get_node(node->y, id);
	if (ret != NULL)
	    return ret;
	ret = get_node(node->n, id);
	return ret;
    }
    else {
	/* it is a leaf and it doesn't match */
	return NULL;
    }
}